

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MissingPropertyTypeHandler.cpp
# Opt level: O2

void Js::MissingPropertyTypeHandler::SetUndefinedPropertySlot(DynamicObject *instance)

{
  Memory::WriteBarrierPtr<void>::WriteBarrierSet
            ((WriteBarrierPtr<void> *)(instance + 1),
             (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).undefinedValue.ptr);
  return;
}

Assistant:

void MissingPropertyTypeHandler::SetUndefinedPropertySlot(DynamicObject* instance)
    {
        Field(Var)* slots = reinterpret_cast<Field(Var)*>(reinterpret_cast<size_t>(instance) + sizeof(DynamicObject));
        slots[0] = instance->GetLibrary()->GetUndefined();
    }